

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

UBool icu_63::GreekUpper::isFollowedByCasedLetter(UChar *s,int32_t i,int32_t length)

{
  int iVar1;
  uint uVar2;
  
  do {
    if (length <= i) {
      return '\0';
    }
    iVar1 = i + 1;
    uVar2 = (uint)(ushort)s[i];
    if ((iVar1 != length && (uVar2 & 0xfc00) == 0xd800) && (((ushort)s[iVar1] & 0xfc00) == 0xdc00))
    {
      uVar2 = (uint)(ushort)s[i] * 0x400 + (uint)(ushort)s[iVar1] + 0xfca02400;
      iVar1 = i + 2;
    }
    i = iVar1;
    uVar2 = ucase_getTypeOrIgnorable_63(uVar2);
  } while ((uVar2 & 4) != 0);
  return uVar2 != 0;
}

Assistant:

UBool isFollowedByCasedLetter(const UChar *s, int32_t i, int32_t length) {
    while (i < length) {
        UChar32 c;
        U16_NEXT(s, i, length, c);
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // Case-ignorable, continue with the loop.
        } else if (type != UCASE_NONE) {
            return TRUE;  // Followed by cased letter.
        } else {
            return FALSE;  // Uncased and not case-ignorable.
        }
    }
    return FALSE;  // Not followed by cased letter.
}